

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void textcolor_cb(Fl_Button *i,void *v)

{
  bool bVar1;
  void *this;
  int iVar2;
  Fl_Color FVar3;
  Fl_Widget_Type *q;
  Fl_Type *o;
  Fl_Color d;
  int mod;
  Fl_Color c;
  int s;
  Fl_Font n;
  void *v_local;
  Fl_Button *i_local;
  
  _s = v;
  v_local = i;
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x2b])(current_widget,0,&c,&mod,&d);
    if (iVar2 == 0) {
      Fl_Widget::deactivate((Fl_Widget *)v_local);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)v_local);
  }
  else {
    bVar1 = false;
    d = Fl_Widget::color(&i->super_Fl_Widget);
    FVar3 = fl_show_colormap(d);
    if (FVar3 == d) {
      return;
    }
    d = FVar3;
    for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
        q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
      if (((q->super_Fl_Type).selected != '\0') &&
         (iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) {
        (*(q->super_Fl_Type)._vptr_Fl_Type[0x2b])(q,3,&c,&mod,&d);
        Fl_Widget::redraw(q->o);
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  Fl_Widget::color((Fl_Widget *)v_local,d);
  this = v_local;
  FVar3 = fl_contrast(0x38,d);
  Fl_Widget::labelcolor((Fl_Widget *)this,FVar3);
  Fl_Widget::redraw((Fl_Widget *)v_local);
  return;
}

Assistant:

void textcolor_cb(Fl_Button* i, void* v) {
  Fl_Font n; int s; Fl_Color c;
  if (v == LOAD) {
    if (!current_widget->textstuff(0,n,s,c)) {i->deactivate(); return;}
    i->activate();
  } else {
    int mod = 0;
    c = i->color();
    Fl_Color d = fl_show_colormap(c);
    if (d == c) return;
    c = d;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->textstuff(3,n,s,c); q->o->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
  i->color(c); i->labelcolor(fl_contrast(FL_BLACK,c)); i->redraw();
}